

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

bool __thiscall cmCTestSVN::NoteNewRevision(cmCTestSVN *this)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  char *msg;
  ulong uVar3;
  string *psVar4;
  string local_238;
  string local_218;
  string local_1f8 [48];
  ostringstream local_1c8 [8];
  ostringstream cmCTestLog_msg;
  string local_50;
  reference local_30;
  SVNInfo *svninfo;
  iterator itend;
  iterator itbeg;
  cmCTestSVN *this_local;
  
  bVar1 = LoadRepositories(this);
  if (bVar1) {
    itend = std::vector<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::begin
                      (&this->Repositories);
    svninfo = (SVNInfo *)
              std::vector<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::end
                        (&this->Repositories);
    while (bVar1 = __gnu_cxx::operator!=
                             (&itend,(__normal_iterator<cmCTestSVN::SVNInfo_*,_std::vector<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>_>
                                      *)&svninfo), bVar1) {
      local_30 = __gnu_cxx::
                 __normal_iterator<cmCTestSVN::SVNInfo_*,_std::vector<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>_>
                 ::operator*(&itend);
      LoadInfo_abi_cxx11_(&local_50,this,local_30);
      std::__cxx11::string::operator=((string *)&local_30->NewRevision,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      poVar2 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                               "Revision for repository \'");
      poVar2 = std::operator<<(poVar2,(string *)local_30);
      poVar2 = std::operator<<(poVar2,"\' after update: ");
      poVar2 = std::operator<<(poVar2,(string *)&local_30->NewRevision);
      std::operator<<(poVar2,"\n");
      std::__cxx11::ostringstream::ostringstream(local_1c8);
      poVar2 = std::operator<<((ostream *)local_1c8,"   New revision of external repository \'");
      poVar2 = std::operator<<(poVar2,(string *)local_30);
      poVar2 = std::operator<<(poVar2,"\' is: ");
      poVar2 = std::operator<<(poVar2,(string *)&local_30->NewRevision);
      std::operator<<(poVar2,"\n");
      this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
      std::__cxx11::ostringstream::str();
      msg = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(this_00,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestSVN.cxx"
                   ,0x8b,msg,false);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::ostringstream::~ostringstream(local_1c8);
      poVar2 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"Repository \'");
      poVar2 = std::operator<<(poVar2,(string *)local_30);
      poVar2 = std::operator<<(poVar2,"\' URL = ");
      poVar2 = std::operator<<(poVar2,(string *)&local_30->URL);
      std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"Repository \'");
      poVar2 = std::operator<<(poVar2,(string *)local_30);
      poVar2 = std::operator<<(poVar2,"\' Root = ");
      poVar2 = std::operator<<(poVar2,(string *)&local_30->Root);
      std::operator<<(poVar2,"\n");
      uVar3 = std::__cxx11::string::empty();
      if (((uVar3 & 1) == 0) &&
         (bVar1 = cmCTestSVNPathStarts(&local_30->URL,&local_30->Root), bVar1)) {
        psVar4 = &local_30->URL;
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)&local_238,(ulong)psVar4);
        cmCTest::DecodeURL(&local_218,&local_238);
        std::__cxx11::string::operator=((string *)&local_30->Base,(string *)&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::operator+=((string *)&local_30->Base,"/");
      }
      poVar2 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"Repository \'");
      poVar2 = std::operator<<(poVar2,(string *)local_30);
      poVar2 = std::operator<<(poVar2,"\' Base = ");
      poVar2 = std::operator<<(poVar2,(string *)&local_30->Base);
      std::operator<<(poVar2,"\n");
      __gnu_cxx::
      __normal_iterator<cmCTestSVN::SVNInfo_*,_std::vector<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>_>
      ::operator++(&itend,0);
    }
    std::__cxx11::string::operator=
              ((string *)&(this->super_cmCTestGlobalVC).NewRevision,
               (string *)&this->RootInfo->NewRevision);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestSVN::NoteNewRevision()
{
  if (!this->LoadRepositories()) {
    return false;
  }

  std::vector<SVNInfo>::iterator itbeg = this->Repositories.begin();
  std::vector<SVNInfo>::iterator itend = this->Repositories.end();
  for (; itbeg != itend; itbeg++) {
    SVNInfo& svninfo = *itbeg;
    svninfo.NewRevision = this->LoadInfo(svninfo);
    this->Log << "Revision for repository '" << svninfo.LocalPath
              << "' after update: " << svninfo.NewRevision << "\n";
    cmCTestLog(
      this->CTest, HANDLER_OUTPUT, "   New revision of external repository '"
        << svninfo.LocalPath << "' is: " << svninfo.NewRevision << "\n");

    // svninfo.Root = ""; // uncomment to test GuessBase
    this->Log << "Repository '" << svninfo.LocalPath
              << "' URL = " << svninfo.URL << "\n";
    this->Log << "Repository '" << svninfo.LocalPath
              << "' Root = " << svninfo.Root << "\n";

    // Compute the base path the working tree has checked out under
    // the repository root.
    if (!svninfo.Root.empty() &&
        cmCTestSVNPathStarts(svninfo.URL, svninfo.Root)) {
      svninfo.Base =
        cmCTest::DecodeURL(svninfo.URL.substr(svninfo.Root.size()));
      svninfo.Base += "/";
    }
    this->Log << "Repository '" << svninfo.LocalPath
              << "' Base = " << svninfo.Base << "\n";
  }

  // Set the global new revision to the one of the root
  this->NewRevision = this->RootInfo->NewRevision;
  return true;
}